

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O1

void __thiscall enact::AstSerialise::visitWhileExpr_abi_cxx11_(AstSerialise *this)

{
  WhileExpr *in_RDX;
  long in_RSI;
  
  visitWhileExpr_abi_cxx11_((string *)this,(AstSerialise *)(in_RSI + -8),in_RDX);
  return;
}

Assistant:

std::string AstSerialise::visitWhileExpr(WhileExpr& expr) {
        std::stringstream s;

        s << m_ident << "(Expr::While " << visitExpr(*expr.condition) << '\n';
        m_ident += "    ";

        s << visitExpr(*expr.body);

        m_ident.erase(0, 4);
        s << m_ident << ")";

        return s.str();
    }